

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3mixw_io.c
# Opt level: O0

int s3mixw_intv_read(char *fn,uint32 mixw_s,uint32 mixw_e,float32 ****out_mixw,uint32 *out_n_mixw,
                    uint32 *out_n_feat,uint32 *out_n_density)

{
  int iVar1;
  uint32 *puVar2;
  FILE *pFVar4;
  uint32 local_64;
  FILE *pFStack_60;
  uint32 swap;
  FILE *fp;
  char *do_chk;
  char *ver;
  uint32 *puStack_40;
  uint32 ignore;
  uint32 *out_n_feat_local;
  uint32 *out_n_mixw_local;
  float32 ****out_mixw_local;
  uint32 mixw_e_local;
  uint32 mixw_s_local;
  char *fn_local;
  undefined4 uVar3;
  undefined4 uVar5;
  
  puStack_40 = out_n_feat;
  out_n_feat_local = out_n_mixw;
  out_n_mixw_local = (uint32 *)out_mixw;
  out_mixw_local._0_4_ = mixw_e;
  out_mixw_local._4_4_ = mixw_s;
  _mixw_e_local = fn;
  pFStack_60 = s3open(fn,"rb",&local_64);
  if (pFStack_60 == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    do_chk = s3get_gvn_fattr("version");
    if (do_chk == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
              ,0x96,"No version attribute for %s\n",_mixw_e_local);
      exit(1);
    }
    iVar1 = strcmp(do_chk,"1.0");
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
              ,0x92,"Version mismatch for %s, file ver: %s != reader ver: %s\n",_mixw_e_local,do_chk
              ,"1.0");
      exit(1);
    }
    fp = (FILE *)s3get_gvn_fattr("chksum0");
    puVar2 = out_n_density;
    pFVar4 = pFStack_60;
    iVar1 = bio_fread_intv_3d((void ****)out_n_mixw_local,4,out_mixw_local._4_4_,
                              (uint32)out_mixw_local,out_n_feat_local,puStack_40,out_n_density,
                              pFStack_60,local_64,(uint32 *)((long)&ver + 4));
    uVar5 = (undefined4)((ulong)pFVar4 >> 0x20);
    uVar3 = (undefined4)((ulong)puVar2 >> 0x20);
    if (iVar1 == 0) {
      s3close(pFStack_60);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
              ,0xad,"Read %s [%ux%ux%u array]\n",_mixw_e_local,(ulong)*out_n_feat_local,
              CONCAT44(uVar3,*puStack_40),CONCAT44(uVar5,*out_n_density));
      fn_local._4_4_ = 0;
    }
    else {
      s3close(pFStack_60);
      fn_local._4_4_ = -1;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3mixw_intv_read(const char *fn,
		 uint32  mixw_s,
		 uint32  mixw_e,
		 float32 ****out_mixw,
		 uint32 *out_n_mixw,
		 uint32 *out_n_feat,
		 uint32 *out_n_density)
{
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, MIXW_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, MIXW_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    /* Read the mixing weight array */
    if (bio_fread_intv_3d((void ****)out_mixw,
		       sizeof(float32),
		       mixw_s,
		       mixw_e,
		       out_n_mixw,
		       out_n_feat,
		       out_n_density,
		       fp,
		       swap,
		       &ignore) != S3_SUCCESS) {
	s3close(fp);
	return S3_ERROR;
    }
    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, *out_n_mixw, *out_n_feat, *out_n_density);

    return S3_SUCCESS;
}